

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<IRR>::clear(vec<IRR> *this,bool dealloc)

{
  byte in_SIL;
  uint *in_RDI;
  uint i;
  uint local_10;
  
  if (*(long *)(in_RDI + 2) != 0) {
    for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
      IRR::~IRR((IRR *)0x27a3d0);
    }
    *in_RDI = 0;
    if ((in_SIL & 1) != 0) {
      in_RDI[1] = 0;
      free(*(void **)(in_RDI + 2));
      in_RDI[2] = 0;
      in_RDI[3] = 0;
    }
  }
  return;
}

Assistant:

void clear(bool dealloc = false) {
		if (!data) {
			return;
		}
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		sz = 0;
		if (dealloc) {
			cap = 0;
			free(data);
			data = nullptr;
		}
	}